

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprCounter>::
ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprCounter>::AlgebraicConHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,ExprCounter> *this)

{
  uint uVar1;
  char *format_str;
  int iVar2;
  char *loc;
  TextReader<fmt::Locale> *this_00;
  ArgList local_58;
  ulong local_48 [3];
  
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  iVar2 = *(int *)(*(long *)(this + 8) + 4);
  if (0 < iVar2) {
    do {
      this_00 = *(TextReader<fmt::Locale> **)this;
      loc = (this_00->super_ReaderBase).ptr_;
      (this_00->super_ReaderBase).token_ = loc;
      (this_00->super_ReaderBase).ptr_ = loc + 1;
      switch(*loc) {
      case '0':
        TextReader<fmt::Locale>::ReadDouble(this_00);
        this_00 = *(TextReader<fmt::Locale> **)this;
      case '1':
      case '2':
      case '4':
        TextReader<fmt::Locale>::ReadDouble(this_00);
        break;
      case '3':
        break;
      case '5':
        TextReader<fmt::Locale>::ReadInt<int>(this_00);
        uVar1 = TextReader<fmt::Locale>::ReadUInt<int>(*(TextReader<fmt::Locale> **)this);
        if ((uVar1 == 0) || (**(int **)(this + 8) < (int)uVar1)) {
          this_00 = *(TextReader<fmt::Locale> **)this;
          local_48[0] = (ulong)uVar1;
          local_58.types_ = 2;
          loc = (this_00->super_ReaderBase).token_;
          format_str = "integer {} out of bounds";
          goto LAB_00106783;
        }
        break;
      default:
        local_48[0] = 0;
        local_48[1] = 0;
        local_58.types_ = 0;
        format_str = "expected bound";
LAB_00106783:
        local_58.field_1.values_ = (Value *)local_48;
        TextReader<fmt::Locale>::DoReportError(this_00,loc,(CStringRef)format_str,&local_58);
      }
      TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadBounds() {
  enum BoundType {
    RANGE,     // Both lower and upper bounds: l <= body <= u.
    UPPER,     // Only upper bound: body <= u.
    LOWER,     // Only lower bound: l <= body.
    FREE,      // No constraints on body (free variable or constraint).
    CONSTANT,  // Equal to constant: body = c.
    COMPL      // Body complements variable v[i - 1].
  };
  reader_.ReadTillEndOfLine();
  double lb = 0, ub = 0;
  BoundHandler bh(*this);
  int num_bounds = bh.num_items();
  double infinity = INFINITY;
  for (int i = 0; i < num_bounds; ++i) {
    switch (reader_.ReadChar() - '0') {
    case RANGE:
      lb = reader_.ReadDouble();
      ub = reader_.ReadDouble();
      break;
    case UPPER:
      lb = -infinity;
      ub = reader_.ReadDouble();
      break;
    case LOWER:
      lb = reader_.ReadDouble();
      ub = infinity;
      break;
    case FREE:
      lb = -infinity;
      ub =  infinity;
      break;
    case CONSTANT:
      lb = ub = reader_.ReadDouble();
      break;
    case COMPL:
      if (BoundHandler::TYPE == CON) {
        int flags = reader_.template ReadInt<int>();
        int var_index = reader_.ReadUInt();
        // Don't use NLReader::ReadUInt(int, int) as num_vars + 1 may overflow.
        if (var_index == 0 || var_index > header_.num_vars)
          reader_.ReportError("integer {} out of bounds", var_index);
        --var_index;
        int mask = ComplInfo::INF_LB | ComplInfo::INF_UB;
        handler_.OnComplementarity(i, var_index, ComplInfo(flags & mask));
        reader_.ReadTillEndOfLine();
        continue;
      }
      reader_.ReportError("COMPL bound type is invalid for variables");
      break;
    default:
      reader_.ReportError("expected bound");
    }
    reader_.ReadTillEndOfLine();
    bh.SetBounds(i, lb, ub);
  }
}